

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_23::
FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
::FlatAllocation(FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                 *this,TypeMap<google::protobuf::(anonymous_namespace)::IntT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                       *ends)

{
  initializer_list<google::protobuf::(anonymous_namespace)::ExpressionEater> iVar1;
  initializer_list<google::protobuf::(anonymous_namespace)::ExpressionEater> iVar2;
  size_t sVar3;
  IntT<char> *pIVar4;
  IntT<std::__cxx11::basic_string<char>_> *pIVar5;
  IntT<google::protobuf::SourceCodeInfo> *pIVar6;
  IntT<google::protobuf::FileDescriptorTables> *pIVar7;
  IntT<google::protobuf::FeatureSet> *pIVar8;
  IntT<google::protobuf::MessageOptions> *pIVar9;
  IntT<google::protobuf::FieldOptions> *pIVar10;
  IntT<google::protobuf::EnumOptions> *pIVar11;
  IntT<google::protobuf::EnumValueOptions> *pIVar12;
  IntT<google::protobuf::ExtensionRangeOptions> *pIVar13;
  IntT<google::protobuf::OneofOptions> *pIVar14;
  IntT<google::protobuf::ServiceOptions> *pIVar15;
  IntT<google::protobuf::MethodOptions> *pIVar16;
  IntT<google::protobuf::FileOptions> *pIVar17;
  bool local_64;
  bool local_63;
  bool local_62;
  bool local_61;
  bool local_60;
  bool local_5f;
  bool local_5e;
  bool local_5d;
  bool local_5c;
  bool local_5b;
  bool local_5a;
  bool local_59;
  bool local_58;
  bool local_57;
  ExpressionEater local_56;
  ExpressionEater EStack_55;
  ExpressionEater EStack_54;
  ExpressionEater EStack_53;
  ExpressionEater EStack_52;
  ExpressionEater EStack_51;
  ExpressionEater EStack_50;
  ExpressionEater EStack_4f;
  ExpressionEater EStack_4e;
  ExpressionEater EStack_4d;
  ExpressionEater EStack_4c;
  ExpressionEater EStack_4b;
  ExpressionEater EStack_4a;
  ExpressionEater EStack_49;
  iterator local_48;
  undefined8 local_40;
  ExpressionEater local_36;
  ExpressionEater EStack_35;
  ExpressionEater EStack_34;
  ExpressionEater EStack_33;
  ExpressionEater EStack_32;
  ExpressionEater EStack_31;
  ExpressionEater EStack_30;
  ExpressionEater EStack_2f;
  ExpressionEater EStack_2e;
  ExpressionEater EStack_2d;
  ExpressionEater EStack_2c;
  ExpressionEater EStack_2b;
  ExpressionEater EStack_2a;
  ExpressionEater EStack_29;
  iterator local_28;
  undefined8 local_20;
  TypeMap<google::protobuf::(anonymous_namespace)::IntT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  *local_18;
  TypeMap<google::protobuf::(anonymous_namespace)::IntT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  *ends_local;
  FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  *this_local;
  
  local_18 = ends;
  ends_local = &this->ends_;
  memcpy(this,ends,0x38);
  sVar3 = RoundUpTo<8>(0x38);
  pIVar4 = TypeMap<google::protobuf::(anonymous_namespace)::IntT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           ::Get<char>(&this->ends_);
  *pIVar4 = *pIVar4 + (int)sVar3;
  (anonymous_namespace)::ExpressionEater::ExpressionEater<int&>(&local_36,pIVar4);
  sVar3 = RoundUpTo<8>(0x38);
  pIVar5 = (anonymous_namespace)::
           TypeMap<google::protobuf::(anonymous_namespace)::IntT,char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
           ::Get<std::__cxx11::string>
                     ((TypeMap<google::protobuf::(anonymous_namespace)::IntT,char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                       *)this);
  *pIVar5 = *pIVar5 + (int)sVar3;
  (anonymous_namespace)::ExpressionEater::ExpressionEater<int&>(&EStack_35,pIVar5);
  sVar3 = RoundUpTo<8>(0x38);
  pIVar6 = TypeMap<google::protobuf::(anonymous_namespace)::IntT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           ::Get<google::protobuf::SourceCodeInfo>(&this->ends_);
  *pIVar6 = *pIVar6 + (int)sVar3;
  (anonymous_namespace)::ExpressionEater::ExpressionEater<int&>(&EStack_34,pIVar6);
  sVar3 = RoundUpTo<8>(0x38);
  pIVar7 = TypeMap<google::protobuf::(anonymous_namespace)::IntT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           ::Get<google::protobuf::FileDescriptorTables>(&this->ends_);
  *pIVar7 = *pIVar7 + (int)sVar3;
  (anonymous_namespace)::ExpressionEater::ExpressionEater<int&>(&EStack_33,pIVar7);
  sVar3 = RoundUpTo<8>(0x38);
  pIVar8 = TypeMap<google::protobuf::(anonymous_namespace)::IntT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           ::Get<google::protobuf::FeatureSet>(&this->ends_);
  *pIVar8 = *pIVar8 + (int)sVar3;
  (anonymous_namespace)::ExpressionEater::ExpressionEater<int&>(&EStack_32,pIVar8);
  sVar3 = RoundUpTo<8>(0x38);
  pIVar9 = TypeMap<google::protobuf::(anonymous_namespace)::IntT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           ::Get<google::protobuf::MessageOptions>(&this->ends_);
  *pIVar9 = *pIVar9 + (int)sVar3;
  (anonymous_namespace)::ExpressionEater::ExpressionEater<int&>(&EStack_31,pIVar9);
  sVar3 = RoundUpTo<8>(0x38);
  pIVar10 = TypeMap<google::protobuf::(anonymous_namespace)::IntT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ::Get<google::protobuf::FieldOptions>(&this->ends_);
  *pIVar10 = *pIVar10 + (int)sVar3;
  (anonymous_namespace)::ExpressionEater::ExpressionEater<int&>(&EStack_30,pIVar10);
  sVar3 = RoundUpTo<8>(0x38);
  pIVar11 = TypeMap<google::protobuf::(anonymous_namespace)::IntT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ::Get<google::protobuf::EnumOptions>(&this->ends_);
  *pIVar11 = *pIVar11 + (int)sVar3;
  (anonymous_namespace)::ExpressionEater::ExpressionEater<int&>(&EStack_2f,pIVar11);
  sVar3 = RoundUpTo<8>(0x38);
  pIVar12 = TypeMap<google::protobuf::(anonymous_namespace)::IntT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ::Get<google::protobuf::EnumValueOptions>(&this->ends_);
  *pIVar12 = *pIVar12 + (int)sVar3;
  (anonymous_namespace)::ExpressionEater::ExpressionEater<int&>(&EStack_2e,pIVar12);
  sVar3 = RoundUpTo<8>(0x38);
  pIVar13 = TypeMap<google::protobuf::(anonymous_namespace)::IntT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ::Get<google::protobuf::ExtensionRangeOptions>(&this->ends_);
  *pIVar13 = *pIVar13 + (int)sVar3;
  (anonymous_namespace)::ExpressionEater::ExpressionEater<int&>(&EStack_2d,pIVar13);
  sVar3 = RoundUpTo<8>(0x38);
  pIVar14 = TypeMap<google::protobuf::(anonymous_namespace)::IntT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ::Get<google::protobuf::OneofOptions>(&this->ends_);
  *pIVar14 = *pIVar14 + (int)sVar3;
  (anonymous_namespace)::ExpressionEater::ExpressionEater<int&>(&EStack_2c,pIVar14);
  sVar3 = RoundUpTo<8>(0x38);
  pIVar15 = TypeMap<google::protobuf::(anonymous_namespace)::IntT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ::Get<google::protobuf::ServiceOptions>(&this->ends_);
  *pIVar15 = *pIVar15 + (int)sVar3;
  (anonymous_namespace)::ExpressionEater::ExpressionEater<int&>(&EStack_2b,pIVar15);
  sVar3 = RoundUpTo<8>(0x38);
  pIVar16 = TypeMap<google::protobuf::(anonymous_namespace)::IntT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ::Get<google::protobuf::MethodOptions>(&this->ends_);
  *pIVar16 = *pIVar16 + (int)sVar3;
  (anonymous_namespace)::ExpressionEater::ExpressionEater<int&>(&EStack_2a,pIVar16);
  sVar3 = RoundUpTo<8>(0x38);
  pIVar17 = TypeMap<google::protobuf::(anonymous_namespace)::IntT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ::Get<google::protobuf::FileOptions>(&this->ends_);
  *pIVar17 = *pIVar17 + (int)sVar3;
  (anonymous_namespace)::ExpressionEater::ExpressionEater<int&>(&EStack_29,pIVar17);
  local_28 = (iterator)&local_36;
  local_20 = 0xe;
  iVar2._M_len = 0xe;
  iVar2._M_array = local_28;
  Fold(iVar2);
  local_57 = Init<char>(this);
  ExpressionEater::ExpressionEater<bool>(&local_56,&local_57);
  local_58 = (anonymous_namespace)::
             FlatAllocation<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
             ::Init<std::__cxx11::string>
                       ((FlatAllocation<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                         *)this);
  ExpressionEater::ExpressionEater<bool>(&EStack_55,&local_58);
  local_59 = Init<google::protobuf::SourceCodeInfo>(this);
  ExpressionEater::ExpressionEater<bool>(&EStack_54,&local_59);
  local_5a = Init<google::protobuf::FileDescriptorTables>(this);
  ExpressionEater::ExpressionEater<bool>(&EStack_53,&local_5a);
  local_5b = Init<google::protobuf::FeatureSet>(this);
  ExpressionEater::ExpressionEater<bool>(&EStack_52,&local_5b);
  local_5c = Init<google::protobuf::MessageOptions>(this);
  ExpressionEater::ExpressionEater<bool>(&EStack_51,&local_5c);
  local_5d = Init<google::protobuf::FieldOptions>(this);
  ExpressionEater::ExpressionEater<bool>(&EStack_50,&local_5d);
  local_5e = Init<google::protobuf::EnumOptions>(this);
  ExpressionEater::ExpressionEater<bool>(&EStack_4f,&local_5e);
  local_5f = Init<google::protobuf::EnumValueOptions>(this);
  ExpressionEater::ExpressionEater<bool>(&EStack_4e,&local_5f);
  local_60 = Init<google::protobuf::ExtensionRangeOptions>(this);
  ExpressionEater::ExpressionEater<bool>(&EStack_4d,&local_60);
  local_61 = Init<google::protobuf::OneofOptions>(this);
  ExpressionEater::ExpressionEater<bool>(&EStack_4c,&local_61);
  local_62 = Init<google::protobuf::ServiceOptions>(this);
  ExpressionEater::ExpressionEater<bool>(&EStack_4b,&local_62);
  local_63 = Init<google::protobuf::MethodOptions>(this);
  ExpressionEater::ExpressionEater<bool>(&EStack_4a,&local_63);
  local_64 = Init<google::protobuf::FileOptions>(this);
  ExpressionEater::ExpressionEater<bool>(&EStack_49,&local_64);
  local_48 = &local_56;
  local_40 = 0xe;
  iVar1._M_len = 0xe;
  iVar1._M_array = local_48;
  Fold(iVar1);
  return;
}

Assistant:

explicit FlatAllocation(const TypeMap<IntT, T...>& ends) : ends_(ends) {
    // The arrays start just after FlatAllocation, so adjust the ends.
    Fold({(ends_.template Get<T>() +=
           RoundUpTo<kMaxAlign>(sizeof(FlatAllocation)))...});
    Fold({Init<T>()...});
  }